

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMesh2.c
# Opt level: O0

void Bmc_MeshTest2(Gia_Man_t *p,int X,int Y,int T,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  abctime aVar7;
  sat_solver *s;
  abctime aVar8;
  bool bVar9;
  undefined8 uVar10;
  int fFound;
  int iGVar_5;
  int iTVar_3;
  int iCVar_2;
  int nNodes;
  int nBuffs;
  int iCVar_1;
  int iGVar_4;
  int iTVar_2;
  int iGVar_3;
  int nAddClauses;
  int iGVar_2;
  int Conf [12] [2];
  int iGVars [4];
  int iTVars [4];
  int iUVar;
  int iCVar;
  int iGVar_1;
  int iTVar_1;
  int nLits;
  int pLits [100];
  int iGVar;
  int iTVar;
  int nClauses;
  int iVar;
  int Lit;
  int RetValue;
  int status;
  int c;
  int g;
  int t;
  int y;
  int x;
  int i;
  int G;
  int I;
  int pN [102] [2];
  int Me [102] [102];
  Gia_Obj_t *pObj;
  sat_solver *pSat;
  abctime clk;
  int fVerbose_local;
  int T_local;
  int Y_local;
  int X_local;
  Gia_Man_t *p_local;
  
  aVar7 = Abc_Clock();
  s = sat_solver_new();
  memset(pN + 0x65,0,0xa290);
  memset(&G,0,0x330);
  iVar1 = Gia_ManPiNum(p);
  i = iVar1;
  iVar2 = Gia_ManAndNum(p);
  x = iVar1 + iVar2;
  iGVar = 0;
  if ((((100 < X) || (100 < Y)) || (100 < T)) || (100 < x)) {
    __assert_fail("X <= 100 && Y <= 100 && T <= 100 && G <= 100",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                  ,0x79,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
  }
  for (y = 0; y < i; y = y + 1) {
    pN[(long)y + -1][1] = -1;
    (&G)[(long)y * 2] = -1;
  }
  y = 0;
  while( true ) {
    bVar9 = false;
    if (y < p->nObjs) {
      Me[0x65]._400_8_ = Gia_ManObj(p,y);
      bVar9 = (Gia_Obj_t *)Me[0x65]._400_8_ != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    iVar1 = Gia_ObjIsAnd((Gia_Obj_t *)Me[0x65]._400_8_);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFaninId0((Gia_Obj_t *)Me[0x65]._400_8_,y);
      (&G)[(long)(y + -1) * 2] = iVar1 + -1;
      iVar1 = Gia_ObjFaninId1((Gia_Obj_t *)Me[0x65]._400_8_,y);
      pN[(long)(y + -1) + -1][1] = iVar1 + -1;
    }
    y = y + 1;
  }
  if (fVerbose != 0) {
    uVar3 = Gia_ManPiNum(p);
    printf("The graph has %d inputs: ",(ulong)uVar3);
    for (y = 0; y < i; y = y + 1) {
      printf("%c ",(ulong)(y + 0x61));
    }
    uVar3 = Gia_ManAndNum(p);
    printf("  and %d nodes: ",(ulong)uVar3);
    for (y = i; y < x; y = y + 1) {
      printf("%c=%c%c ",(ulong)(y + 0x61),(ulong)((&G)[(long)y * 2] + 0x61),
             (ulong)(pN[(long)y + -1][1] + 0x61));
    }
    printf("\n");
  }
  iTVar = 0;
  for (g = 0; g < Y; g = g + 1) {
    for (t = 0; t < X; t = t + 1) {
      Me[(long)t + -1][(long)g + 100] = iTVar;
      iTVar = T + x + 0x11 + iTVar;
    }
  }
  if (fVerbose != 0) {
    printf("SAT variable count is %d (%d time vars + %d graph vars + %d config vars + %d aux vars)\n"
           ,(ulong)(uint)iTVar,(ulong)(uint)(X * Y * T),(ulong)(uint)(X * Y * x),
           (ulong)(uint)(X * Y * 0x10),(ulong)(uint)(X * Y));
  }
  for (t = 0; t < X; t = t + 1) {
    for (g = 0; g < Y; g = g + 1) {
      iVar1 = Bmc_MeshTVar((int (*) [102])(pN + 0x65),t,g);
      pLits[99] = Bmc_MeshGVar((int (*) [102])(pN + 0x65),t,g);
      if (((t == 0) || (t == X + -1)) || ((g == 0 || (g == Y + -1)))) {
        for (c = 0; c < T; c = c + 1) {
          nClauses = Abc_Var2Lit(iVar1 + c,(uint)(0 < c));
          iVar = sat_solver_addclause(s,&nClauses,&iVar);
          if (iVar == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                          ,0xac,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
          }
        }
        for (status = i; status < x; status = status + 1) {
          nClauses = Abc_Var2Lit(pLits[99] + status,1);
          iVar = sat_solver_addclause(s,&nClauses,&iVar);
          if (iVar == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                          ,0xb2,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
          }
        }
      }
      else {
        nClauses = Abc_Var2Lit(iVar1,1);
        iVar = sat_solver_addclause(s,&nClauses,&iVar);
        if (iVar == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                        ,0xb8,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
        }
      }
    }
  }
  for (t = 1; t < X + -1; t = t + 1) {
    for (g = 1; g < Y + -1; g = g + 1) {
      iVar1 = Bmc_MeshTVar((int (*) [102])(pN + 0x65),t,g);
      iVar2 = Bmc_MeshGVar((int (*) [102])(pN + 0x65),t,g);
      iVar4 = Bmc_MeshCVar((int (*) [102])(pN + 0x65),t,g);
      iVar5 = Bmc_MeshUVar((int (*) [102])(pN + 0x65),t,g);
      iGVars[2] = Bmc_MeshTVar((int (*) [102])(pN + 0x65),t + -1,g);
      Conf[0xb][0] = Bmc_MeshGVar((int (*) [102])(pN + 0x65),t + -1,g);
      iGVars[3] = Bmc_MeshTVar((int (*) [102])(pN + 0x65),t,g + -1);
      Conf[0xb][1] = Bmc_MeshGVar((int (*) [102])(pN + 0x65),t,g + -1);
      Bmc_MeshTVar((int (*) [102])(pN + 0x65),t + 1,g);
      iGVars[0] = Bmc_MeshGVar((int (*) [102])(pN + 0x65),t + 1,g);
      Bmc_MeshTVar((int (*) [102])(pN + 0x65),t,g + 1);
      iGVars[1] = Bmc_MeshGVar((int (*) [102])(pN + 0x65),t,g + 1);
      for (status = 0; status < x; status = status + 1) {
        iTVar_1 = Abc_Var2Lit(iVar2 + status,1);
        nLits = Abc_Var2Lit(iVar5,0);
        iVar = sat_solver_addclause(s,&iTVar_1,pLits);
        if (iVar == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                        ,0xda,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
        }
        iGVar = iGVar + 1;
      }
      iTVar_1 = Abc_Var2Lit(iVar5,1);
      for (c = 1; c < T; c = c + 1) {
        iVar6 = Abc_Var2Lit(iVar1 + c,0);
        (&iTVar_1)[c] = iVar6;
      }
      iVar = sat_solver_addclause(s,&iTVar_1,&iTVar_1 + T);
      if (iVar == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                      ,0xe2,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
      }
      iTVar_1 = Abc_Var2Lit(iVar5,1);
      for (RetValue = 0; RetValue < 0x10; RetValue = RetValue + 1) {
        iVar5 = Abc_Var2Lit(iVar4 + RetValue,0);
        (&iTVar_1)[RetValue + 1] = iVar5;
      }
      iVar = sat_solver_addclause(s,&iTVar_1,pLits + 0xf);
      if (iVar == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                      ,0xe9,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
      }
      iGVar = iGVar + 2;
      for (c = 1; c < T; c = c + 1) {
        memcpy(&nAddClauses,&DAT_00caf5e0,0x60);
        for (status = 0; status < x; status = status + 1) {
          for (RetValue = 0; RetValue < 4; RetValue = RetValue + 1) {
            iTVar_1 = Abc_Var2Lit(iVar1 + c,1);
            nLits = Abc_Var2Lit(iVar2 + status,1);
            pLits[0] = Abc_Var2Lit(iVar4 + RetValue,1);
            pLits[1] = Abc_Var2Lit(iGVars[(long)RetValue + 2] + c + -1,0);
            iVar = sat_solver_addclause(s,&iTVar_1,pLits + 2);
            if (iVar == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                            ,0xf9,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
            }
            iTVar_1 = Abc_Var2Lit(iVar1 + c,1);
            nLits = Abc_Var2Lit(iVar2 + status,1);
            pLits[0] = Abc_Var2Lit(iVar4 + RetValue,1);
            pLits[1] = Abc_Var2Lit(iGVars[(long)RetValue + -2] + status,0);
            iVar = sat_solver_addclause(s,&iTVar_1,pLits + 2);
            if (iVar == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                            ,0x100,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
            }
            iGVar = iGVar + 2;
          }
        }
        for (status = 0; status < i; status = status + 1) {
          for (RetValue = 4; RetValue < 0x10; RetValue = RetValue + 1) {
            iTVar_1 = Abc_Var2Lit(iVar2 + status,1);
            nLits = Abc_Var2Lit(iVar4 + RetValue,1);
            iVar = sat_solver_addclause(s,&iTVar_1,pLits);
            if (iVar == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                            ,0x109,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
            }
            iGVar = iGVar + 1;
          }
        }
        for (status = i; status < x; status = status + 1) {
          for (RetValue = 0; RetValue < 0xc; RetValue = RetValue + 1) {
            if (((&G)[(long)status * 2] < 0) || (pN[(long)status + -1][1] < 0)) {
              __assert_fail("pN[g][0] >= 0 && pN[g][1] >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                            ,0x110,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
            }
            if ((status <= (&G)[(long)status * 2]) || (status <= pN[(long)status + -1][1])) {
              __assert_fail("pN[g][0] < g && pN[g][1] < g",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                            ,0x111,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
            }
            iTVar_1 = Abc_Var2Lit(iVar1 + c,1);
            nLits = Abc_Var2Lit(iVar2 + status,1);
            pLits[0] = Abc_Var2Lit(iVar4 + RetValue + 4,1);
            pLits[1] = Abc_Var2Lit(iGVars[(long)(&nAddClauses)[(long)RetValue * 2] + 2] + c + -1,0);
            iVar = sat_solver_addclause(s,&iTVar_1,pLits + 2);
            if (iVar == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                            ,0x118,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
            }
            iTVar_1 = Abc_Var2Lit(iVar1 + c,1);
            nLits = Abc_Var2Lit(iVar2 + status,1);
            pLits[0] = Abc_Var2Lit(iVar4 + RetValue + 4,1);
            pLits[1] = Abc_Var2Lit(iGVars[(long)Conf[(long)RetValue + -1][1] + 2] + c + -1,0);
            iVar = sat_solver_addclause(s,&iTVar_1,pLits + 2);
            if (iVar == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                            ,0x11f,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
            }
            iTVar_1 = Abc_Var2Lit(iVar1 + c,1);
            nLits = Abc_Var2Lit(iVar2 + status,1);
            pLits[0] = Abc_Var2Lit(iVar4 + RetValue + 4,1);
            pLits[1] = Abc_Var2Lit(iGVars[(long)(&nAddClauses)[(long)RetValue * 2] + -2] +
                                   (&G)[(long)status * 2],0);
            iVar = sat_solver_addclause(s,&iTVar_1,pLits + 2);
            if (iVar == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                            ,0x127,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
            }
            iTVar_1 = Abc_Var2Lit(iVar1 + c,1);
            nLits = Abc_Var2Lit(iVar2 + status,1);
            pLits[0] = Abc_Var2Lit(iVar4 + RetValue + 4,1);
            pLits[1] = Abc_Var2Lit(iGVars[(long)Conf[(long)RetValue + -1][1] + -2] +
                                   pN[(long)status + -1][1],0);
            iVar = sat_solver_addclause(s,&iTVar_1,pLits + 2);
            if (iVar == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                            ,0x12e,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
            }
            iGVar = iGVar + 4;
          }
        }
      }
    }
  }
  iVar1 = Bmc_MeshGVar((int (*) [102])(pN + 0x65),1,1);
  nClauses = Abc_Var2Lit(iVar1 + x + -1,0);
  iVar = sat_solver_addclause(s,&nClauses,&iVar);
  if (iVar == 0) {
    printf("Problem has no solution. ");
    aVar8 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar8 - aVar7);
    sat_solver_delete(s);
  }
  else {
    if (fVerbose != 0) {
      printf("Finished adding %d clauses. Started solving...\n",(ulong)(uint)iGVar);
    }
    while( true ) {
      iTVar_2 = 0;
      uVar10 = 0;
      Lit = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
      if (Lit == -1) break;
      if (Lit == 0) {
        printf("Computation timed out. ");
        goto LAB_006dca62;
      }
      if (Lit != 1) {
        __assert_fail("status == l_True",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh2.c"
                      ,0x159,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
      }
      for (t = 0; t < X; t = t + 1) {
        for (g = 0; g < Y; g = g + 1) {
          if ((((t == 0) || (t == X + -1)) || (g == 0)) || (g == Y + -1)) {
            iVar1 = Bmc_MeshGVar((int (*) [102])(pN + 0x65),t,g);
            iVar1 = Bmc_MeshAddOneHotness2(s,iVar1,iVar1 + x);
            iTVar_2 = iVar1 + iTVar_2;
          }
          else {
            iVar1 = Bmc_MeshTVar((int (*) [102])(pN + 0x65),t,g);
            iVar2 = Bmc_MeshGVar((int (*) [102])(pN + 0x65),t,g);
            iVar4 = Bmc_MeshCVar((int (*) [102])(pN + 0x65),t,g);
            iVar1 = Bmc_MeshAddOneHotness2(s,iVar1,iVar1 + T);
            iVar2 = Bmc_MeshAddOneHotness2(s,iVar2,iVar2 + x);
            iVar4 = Bmc_MeshAddOneHotness2(s,iVar4,iVar4 + 0x10);
            iTVar_2 = iVar4 + iVar2 + iVar1 + iTVar_2;
          }
        }
      }
      if (iTVar_2 < 1) {
        printf("Satisfying solution found. ");
        goto LAB_006dca62;
      }
      printf("Adding %d one-hotness clauses.\n",(ulong)(uint)iTVar_2);
    }
    printf("Problem has no solution. ");
LAB_006dca62:
    aVar8 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar8 - aVar7);
    if (Lit == 1) {
      iCVar_2 = 0;
      iTVar_3 = 0;
      for (g = 1; g < Y + -1; g = g + 1) {
        for (t = 1; t < X + -1; t = t + 1) {
          iVar1 = Bmc_MeshCVar((int (*) [102])(pN + 0x65),t,g);
          for (RetValue = 0; RetValue < 4; RetValue = RetValue + 1) {
            iVar2 = Bmc_MeshVarValue2(s,iVar1 + RetValue);
            if (iVar2 != 0) {
              iCVar_2 = iCVar_2 + 1;
            }
          }
          for (RetValue = 4; RetValue < 0x10; RetValue = RetValue + 1) {
            iVar2 = Bmc_MeshVarValue2(s,iVar1 + RetValue);
            if (iVar2 != 0) {
              iTVar_3 = iTVar_3 + 1;
            }
          }
        }
      }
      printf("The %d x %d mesh with latency %d with %d active cells (%d nodes and %d buffers):\n",
             (ulong)(uint)X,(ulong)(uint)Y,(ulong)(uint)T,(ulong)(uint)(iTVar_3 + iCVar_2),
             (ulong)(uint)iTVar_3,CONCAT44((int)((ulong)uVar10 >> 0x20),iCVar_2));
      printf(" Y\\X ");
      for (t = 0; t < X; t = t + 1) {
        printf("  %-2d ",(ulong)(uint)t);
      }
      printf("\n");
      for (g = 0; g < Y; g = g + 1) {
        printf(" %-2d  ",(ulong)(uint)g);
        for (t = 0; t < X; t = t + 1) {
          iVar1 = Bmc_MeshTVar((int (*) [102])(pN + 0x65),t,g);
          iVar2 = Bmc_MeshGVar((int (*) [102])(pN + 0x65),t,g);
          bVar9 = false;
          for (c = 0; c < T; c = c + 1) {
            for (status = 0; status < x; status = status + 1) {
              iVar4 = Bmc_MeshVarValue2(s,iVar1 + c);
              if ((iVar4 != 0) && (iVar4 = Bmc_MeshVarValue2(s,iVar2 + status), iVar4 != 0)) {
                printf(" %c%-2d ",(ulong)(status + 0x61),(ulong)(uint)c);
                bVar9 = true;
              }
            }
          }
          if (!bVar9) {
            if (((t == 0) || (t == X + -1)) || ((g == 0 || (g == Y + -1)))) {
              printf("  *  ");
            }
            else {
              printf("     ");
            }
          }
        }
        printf("\n");
      }
    }
    sat_solver_delete(s);
  }
  return;
}

Assistant:

void Bmc_MeshTest2( Gia_Man_t * p, int X, int Y, int T, int fVerbose )
{
    abctime clk = Abc_Clock();
//    sat_solver * pSat = satoko_create();
    sat_solver * pSat = sat_solver_new();
    Gia_Obj_t * pObj;
    int Me[102][102] = {{0}};
    int pN[102][2] = {{0}};
    int I = Gia_ManPiNum(p);
    int G = I + Gia_ManAndNum(p);
    int i, x, y, t, g, c, status, RetValue, Lit, iVar, nClauses = 0;

    assert( X <= 100 && Y <= 100 && T <= 100 && G <= 100 );

    // init the graph
    for ( i = 0; i < I; i++ )
        pN[i][0] = pN[i][1] = -1;
    Gia_ManForEachAnd( p, pObj, i )
    {
        pN[i-1][0] = Gia_ObjFaninId0(pObj, i)-1;
        pN[i-1][1] = Gia_ObjFaninId1(pObj, i)-1;
    }
    if ( fVerbose )
    {
        printf( "The graph has %d inputs: ", Gia_ManPiNum(p) );
        for ( i = 0; i < I; i++ )
            printf( "%c ", 'a' + i );
        printf( "  and %d nodes: ", Gia_ManAndNum(p) );
        for ( i = I; i < G; i++ )
            printf( "%c=%c%c ", 'a' + i, 'a' + pN[i][0] , 'a' + pN[i][1] );
        printf( "\n" );
    }

    // init SAT variables (time vars + graph vars + config vars)
    // config variables: 16 = 4 buff vars + 12 node vars
    iVar = 0;
    for ( y = 0; y < Y; y++ )
    for ( x = 0; x < X; x++ )
    {
        //printf( "%3d %3d %3d    %s", iVar, iVar+T, iVar+T+G, x == X-1 ? "\n":"" );
        Me[x][y] = iVar;
        iVar += T + G + NCPARS + 1;
    }
    Me[101][100] = T;
    Me[101][101] = G;
    if ( fVerbose )
        printf( "SAT variable count is %d (%d time vars + %d graph vars + %d config vars + %d aux vars)\n", iVar, X*Y*T, X*Y*G, X*Y*NCPARS, X*Y );

    // add constraints

    // time 0 and primary inputs only on the boundary
    for ( x = 0; x < X; x++ )
    for ( y = 0; y < Y; y++ )
    {
        int iTVar = Bmc_MeshTVar( Me, x, y );
        int iGVar = Bmc_MeshGVar( Me, x, y );

        if ( x == 0 || x == X-1 || y == 0 || y == Y-1 ) // boundary
        {
            // time 0 is required
            for ( t = 0; t < T; t++ )
            {
                Lit = Abc_Var2Lit( iTVar+t, (int)(t > 0) );
                RetValue = sat_solver_addclause( pSat, &Lit, &Lit+1 );  assert( RetValue );
            }
            // internal nodes are not allowed
            for ( g = I; g < G; g++ )
            {
                Lit = Abc_Var2Lit( iGVar+g, 1 );
                RetValue = sat_solver_addclause( pSat, &Lit, &Lit+1 );  assert( RetValue );
            }
        }
        else // not a boundary
        {
            Lit = Abc_Var2Lit( iTVar, 1 );  // cannot have time 0
            RetValue = sat_solver_addclause( pSat, &Lit, &Lit+1 );  assert( RetValue );
        }
    }
    for ( x = 1; x < X-1; x++ )
    for ( y = 1; y < Y-1; y++ )
    {
        int pLits[100], nLits;

        int iTVar = Bmc_MeshTVar( Me, x, y );
        int iGVar = Bmc_MeshGVar( Me, x, y );
        int iCVar = Bmc_MeshCVar( Me, x, y );
        int iUVar = Bmc_MeshUVar( Me, x, y );

        // 0=left  1=up  2=right  3=down
        int iTVars[4]; 
        int iGVars[4];

        iTVars[0] = Bmc_MeshTVar( Me, x-1, y );
        iGVars[0] = Bmc_MeshGVar( Me, x-1, y );

        iTVars[1] = Bmc_MeshTVar( Me, x, y-1 );
        iGVars[1] = Bmc_MeshGVar( Me, x, y-1 );

        iTVars[2] = Bmc_MeshTVar( Me, x+1, y );
        iGVars[2] = Bmc_MeshGVar( Me, x+1, y );

        iTVars[3] = Bmc_MeshTVar( Me, x, y+1 );
        iGVars[3] = Bmc_MeshGVar( Me, x, y+1 );

        // condition when cell is used
        for ( g = 0; g < G; g++ )
        {
            pLits[0] = Abc_Var2Lit( iGVar+g, 1 );
            pLits[1] = Abc_Var2Lit( iUVar, 0 );
            RetValue = sat_solver_addclause( pSat, pLits, pLits+2 );  assert( RetValue );
            nClauses++;
        }

        // at least one time is used
        pLits[0] = Abc_Var2Lit( iUVar, 1 );
        for ( t = 1; t < T; t++ )
            pLits[t] = Abc_Var2Lit( iTVar+t, 0 );
        RetValue = sat_solver_addclause( pSat, pLits, pLits+T );  assert( RetValue );
        nClauses++;

        // at least one config is used
        pLits[0] = Abc_Var2Lit( iUVar, 1 );
        for ( c = 0; c < NCPARS; c++ )
            pLits[c+1] = Abc_Var2Lit( iCVar+c, 0 );
        RetValue = sat_solver_addclause( pSat, pLits, pLits+NCPARS+1 );  assert( RetValue );
        nClauses++;

        // constraints for each time
        for ( t = 1; t < T; t++ )
        {
            int Conf[12][2] = {{0, 1}, {0, 2}, {0, 3}, {1, 2}, {1, 3}, {2, 3},   {1, 0}, {2, 0}, {3, 0}, {2, 1}, {3, 1}, {3, 2}};
            // buffer
            for ( g = 0; g < G; g++ )
            for ( c = 0; c < 4; c++ )
            {
                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iTVars[c]+t-1, 0 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+nLits );  assert( RetValue );

                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVars[c]+g, 0 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+nLits );  assert( RetValue );

                nClauses += 2;
            }
            for ( g = 0; g < I; g++ )
            for ( c = 4; c < NCPARS; c++ )
            {
                pLits[0] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[1] = Abc_Var2Lit( iCVar+c, 1 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+2 );  assert( RetValue );
                nClauses++;
            }
            // node
            for ( g = I; g < G; g++ )
            for ( c = 0; c < 12; c++ )
            {
                assert( pN[g][0] >= 0 && pN[g][1] >= 0 );
                assert( pN[g][0] <  g && pN[g][1] <  g );

                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c+4, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iTVars[Conf[c][0]]+t-1, 0 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+nLits );  assert( RetValue );

                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c+4, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iTVars[Conf[c][1]]+t-1, 0 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+nLits );  assert( RetValue );


                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c+4, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVars[Conf[c][0]]+pN[g][0], 0 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+nLits );  assert( RetValue );

                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c+4, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVars[Conf[c][1]]+pN[g][1], 0 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+nLits );  assert( RetValue );

                nClauses += 4;
            }
        }
    }

    // final condition
    {
        int iGVar = Bmc_MeshGVar( Me, 1, 1 ) + G-1;
        Lit = Abc_Var2Lit( iGVar, 0 );
        RetValue = sat_solver_addclause( pSat, &Lit, &Lit+1 );  
        if ( RetValue == 0 )
        {
            printf( "Problem has no solution. " );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
//            satoko_destroy( pSat );
            sat_solver_delete( pSat );
            return;
        }
    }

    if ( fVerbose )
        printf( "Finished adding %d clauses. Started solving...\n", nClauses );

    while ( 1 )
    {
        int nAddClauses = 0;
//        status = satoko_solve( pSat );
        status = sat_solver_solve( pSat, NULL, NULL, 0, 0, 0, 0 );
//        if ( status == SATOKO_UNSAT )
        if ( status == l_False )
        {
            printf( "Problem has no solution. " );
            break;
        }
//        if ( status == SATOKO_UNDEC )
        if ( status == l_Undef )
        {
            printf( "Computation timed out. " );
            break;
        }
//        assert( status == SATOKO_SAT );
        assert( status == l_True );
        // check if the solution is valid and add constraints
        for ( x = 0; x < X; x++ )
        for ( y = 0; y < Y; y++ )
        {
            if ( x == 0 || x == X-1 || y == 0 || y == Y-1 ) // boundary
            {
                int iGVar = Bmc_MeshGVar( Me, x, y );
                nAddClauses += Bmc_MeshAddOneHotness2( pSat, iGVar, iGVar + G );
            }
            else
            {
                int iTVar = Bmc_MeshTVar( Me, x, y );
                int iGVar = Bmc_MeshGVar( Me, x, y );
                int iCVar = Bmc_MeshCVar( Me, x, y );
                nAddClauses += Bmc_MeshAddOneHotness2( pSat, iTVar, iTVar + T );
                nAddClauses += Bmc_MeshAddOneHotness2( pSat, iGVar, iGVar + G );
                nAddClauses += Bmc_MeshAddOneHotness2( pSat, iCVar, iCVar + NCPARS );
            }
        }
        if ( nAddClauses > 0 )
        {
            printf( "Adding %d one-hotness clauses.\n", nAddClauses );
            continue;
        }
        printf( "Satisfying solution found. " );
/*
//        iVar = satoko_varnum(pSat);
        iVar = sat_solver_nvars(pSat);
        for ( i = 0; i < iVar; i++ )
            if ( Bmc_MeshVarValue2(pSat, i) )
                printf( "%d ", i );
        printf( "\n" );
*/
        break;
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
//    if ( status == SATOKO_SAT )
    if ( status == l_True )
    {
        // count the number of nodes and buffers
        int nBuffs = 0, nNodes = 0;
        for ( y = 1; y < Y-1; y++ )
        for ( x = 1; x < X-1; x++ )
        {
            int iCVar = Bmc_MeshCVar( Me, x, y );
            for ( c = 0; c < 4; c++ )
                if ( Bmc_MeshVarValue2(pSat, iCVar+c) )
                {
                    //printf( "Buffer y=%d x=%d  (var = %d; config = %d)\n", y, x, iCVar+c, c );
                    nBuffs++;
                }
            for ( c = 4; c < NCPARS; c++ )
                if ( Bmc_MeshVarValue2(pSat, iCVar+c) )
                {
                    //printf( "Node   y=%d x=%d  (var = %d; config = %d)\n", y, x, iCVar+c, c );
                    nNodes++;
                }
        }
        printf( "The %d x %d mesh with latency %d with %d active cells (%d nodes and %d buffers):\n", X, Y, T, nNodes+nBuffs, nNodes, nBuffs );
        // print mesh
        printf( " Y\\X " );
        for ( x = 0; x < X; x++ )
            printf( "  %-2d ", x );
        printf( "\n" );
        for ( y = 0; y < Y; y++ )
        {
            printf( " %-2d  ", y );
            for ( x = 0; x < X; x++ )
            {
                int iTVar  = Bmc_MeshTVar( Me, x, y );
                int iGVar  = Bmc_MeshGVar( Me, x, y );

                int fFound = 0;                ;
                for ( t = 0; t < T; t++ )
                for ( g = 0; g < G; g++ )
                    if ( Bmc_MeshVarValue2(pSat, iTVar+t) && Bmc_MeshVarValue2(pSat, iGVar+g) )
                    {
                        printf( " %c%-2d ", 'a' + g, t );
                        fFound = 1;
                    }
                if ( fFound )
                    continue;
                if ( x == 0 || x == X-1 || y == 0 || y == Y-1 ) // boundary
                    printf( "  *  " );
                else
                    printf( "     " );
            }
            printf( "\n" );
        }
    }
    //satoko_destroy( pSat );
    sat_solver_delete( pSat );
}